

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_as_strings.h
# Opt level: O2

string * join_as_strings<ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,std::vector<int,std::allocator<int>>>>>
                   (string *__return_storage_ptr__,
                   drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<int,_std::allocator<int>_>_>_>
                   *range,string_view separator)

{
  undefined1 local_50 [24];
  _Vector_base<int,_std::allocator<int>_> local_38;
  size_type local_20;
  undefined1 *local_18;
  
  local_50._8_8_ = separator._M_str;
  local_50._0_8_ = separator._M_len;
  local_38._M_impl.super__Vector_impl_data._M_start =
       (range->range).t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38._M_impl.super__Vector_impl_data._M_finish =
       (range->range).t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage =
       (range->range).t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (range->range).t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (range->range).t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (range->range).t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_20 = range->n;
  local_18 = &ezy::cpo::to_string;
  ezy::
  join<std::__cxx11::string,ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,std::vector<int,std::allocator<int>>>>>,ezy::to_string_fn_const&>,std::basic_string_view<char,std::char_traits<char>>&>
            (__return_storage_ptr__,(ezy *)(local_50 + 0x10),
             (range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<int,_std::allocator<int>_>_>_>_>,_const_ezy::to_string_fn_&>
              *)local_50,(basic_string_view<char,_std::char_traits<char>_> *)&ezy::cpo::to_string);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string
join_as_strings(Range&& range, std::string_view separator = "")
{
  return ezy::join(ezy::transform(std::forward<Range>(range), ezy::to_string), separator);
}